

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O2

void __thiscall
FastPForLib::VByte::encodeToByteArray
          (VByte *this,uint32_t *in,size_t length,uint8_t *bout,size_t *nvalue)

{
  uint uVar1;
  size_t k;
  size_t sVar2;
  byte *pbVar3;
  byte bVar4;
  long lVar5;
  
  pbVar3 = bout;
  for (sVar2 = 0; length != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = in[sVar2];
    bVar4 = (byte)uVar1;
    if (uVar1 < 0x80) {
      *pbVar3 = bVar4;
      lVar5 = 1;
    }
    else if (uVar1 < 0x4000) {
      *pbVar3 = bVar4 | 0x80;
      pbVar3[1] = (byte)(uVar1 >> 7);
      lVar5 = 2;
    }
    else if (uVar1 < 0x200000) {
      *pbVar3 = bVar4 | 0x80;
      pbVar3[1] = (byte)(uVar1 >> 7) | 0x80;
      pbVar3[2] = (byte)(uVar1 >> 0xe);
      lVar5 = 3;
    }
    else {
      *pbVar3 = bVar4 | 0x80;
      pbVar3[1] = (byte)(uVar1 >> 7) | 0x80;
      pbVar3[2] = (byte)(uVar1 >> 0xe) | 0x80;
      bVar4 = (byte)(uVar1 >> 0x15);
      if (uVar1 < 0x10000000) {
        pbVar3[3] = bVar4;
        lVar5 = 4;
      }
      else {
        pbVar3[3] = bVar4 | 0x80;
        lVar5 = 5;
        pbVar3[4] = (byte)(uVar1 >> 0x1c);
      }
    }
    pbVar3 = pbVar3 + lVar5;
  }
  *nvalue = (long)pbVar3 - (long)bout;
  return;
}

Assistant:

void encodeToByteArray(const uint32_t *in, const size_t length, uint8_t *bout,
                         size_t &nvalue) {
    const uint8_t *const initbout = bout;
    for (size_t k = 0; k < length; ++k) {
      const uint32_t val = in[k];
      /**
       * Code below could be shorter. Whether it could be faster
       * depends on your compiler and machine.
       */
      if (val < (1U << 7)) {
        *bout = val & 0x7F;
        ++bout;
      } else if (val < (1U << 14)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 7);
        ++bout;
      } else if (val < (1U << 21)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 14);
        ++bout;
      } else if (val < (1U << 28)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 21);
        ++bout;
      } else {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 21) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 28);
        ++bout;
      }
    }
    nvalue = bout - initbout;
  }